

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

drmp3_bool32
drmp3_find_closest_seek_point(drmp3 *pMP3,drmp3_uint64 frameIndex,drmp3_uint32 *pSeekPointIndex)

{
  code *pcVar1;
  SDL_AssertState SVar2;
  drmp3_bool32 dVar3;
  uint local_2c;
  SDL_AssertState sdl_assert_state;
  drmp3_uint32 iSeekPoint;
  drmp3_uint32 *pSeekPointIndex_local;
  drmp3_uint64 frameIndex_local;
  drmp3 *pMP3_local;
  
  do {
    if (pSeekPointIndex != (drmp3_uint32 *)0x0) goto LAB_001297cc;
    SVar2 = (*SDL20_ReportAssertion)
                      (&drmp3_find_closest_seek_point::sdl_assert_data,
                       "drmp3_find_closest_seek_point",
                       "/workspace/llm4binary/github/license_c_cmakelists/libsdl-org[P]sdl12-compat/src/dr_mp3.h"
                       ,0xf12);
  } while (SVar2 == SDL_ASSERTION_RETRY);
  if (SVar2 == SDL_ASSERTION_BREAK) {
    pcVar1 = (code *)swi(3);
    dVar3 = (*pcVar1)();
    return dVar3;
  }
LAB_001297cc:
  *pSeekPointIndex = 0;
  if (frameIndex < pMP3->pSeekPoints->pcmFrameIndex) {
    pMP3_local._4_4_ = 0;
  }
  else {
    local_2c = 0;
    while ((local_2c < pMP3->seekPointCount &&
           (pMP3->pSeekPoints[local_2c].pcmFrameIndex <= frameIndex))) {
      *pSeekPointIndex = local_2c;
      local_2c = local_2c + 1;
    }
    pMP3_local._4_4_ = 1;
  }
  return pMP3_local._4_4_;
}

Assistant:

static drmp3_bool32 drmp3_find_closest_seek_point(drmp3* pMP3, drmp3_uint64 frameIndex, drmp3_uint32* pSeekPointIndex)
{
    drmp3_uint32 iSeekPoint;

    DRMP3_ASSERT(pSeekPointIndex != NULL);

    *pSeekPointIndex = 0;

    if (frameIndex < pMP3->pSeekPoints[0].pcmFrameIndex) {
        return DRMP3_FALSE;
    }

    /* Linear search for simplicity to begin with while I'm getting this thing working. Once it's all working change this to a binary search. */
    for (iSeekPoint = 0; iSeekPoint < pMP3->seekPointCount; ++iSeekPoint) {
        if (pMP3->pSeekPoints[iSeekPoint].pcmFrameIndex > frameIndex) {
            break;  /* Found it. */
        }

        *pSeekPointIndex = iSeekPoint;
    }

    return DRMP3_TRUE;
}